

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O2

void __thiscall lzham::search_accelerator::reset(search_accelerator *this)

{
  uint uVar1;
  
  this->m_cur_dict_size = 0;
  this->m_lookahead_pos = 0;
  this->m_lookahead_size = 0;
  this->m_fill_lookahead_pos = 0;
  this->m_fill_lookahead_size = 0;
  this->m_fill_dict_size = 0;
  this->m_num_completed_helper_threads = 0;
  uVar1 = (this->m_hash).m_size;
  if (uVar1 != 0) {
    memset((this->m_hash).m_p,0,(ulong)(uVar1 << 2));
  }
  uVar1 = (this->m_digram_hash).m_size;
  if (uVar1 != 0) {
    memset((this->m_digram_hash).m_p,0,(ulong)(uVar1 << 2));
    return;
  }
  return;
}

Assistant:

void search_accelerator::reset()
   {
      m_cur_dict_size = 0;
      m_lookahead_size = 0;
      m_lookahead_pos = 0;
      m_fill_lookahead_pos = 0;
      m_fill_lookahead_size = 0;
      m_fill_dict_size = 0;
      m_num_completed_helper_threads = 0;

      // Clearing the hash tables is only necessary for determinism (otherwise, it's possible the matches returned after a reset will depend on the data processes before the reset).
      if (m_hash.size()) 
         memset(m_hash.get_ptr(), 0, m_hash.size_in_bytes());
      
      if (m_digram_hash.size())
         memset(m_digram_hash.get_ptr(), 0, m_digram_hash.size_in_bytes());
      
      // Shouldn't be necessary
      //if (m_deterministic)
      //   memset(m_nodes.get_ptr(), 0, m_nodes.size_in_bytes());
   }